

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O2

spv_result_t
anon_unknown.dwarf_1b01c9::spvTextEncodeOpcode
          (AssemblyGrammar *grammar,AssemblyContext *context,spv_instruction_t *pInst)

{
  spv_position_t *psVar1;
  spv_operand_type_t type;
  pointer puVar2;
  char cVar3;
  bool bVar4;
  spv_result_t sVar5;
  spv_result_t sVar6;
  int32_t iVar7;
  uint32_t uVar8;
  ulong uVar9;
  spv_result_t unaff_EBP;
  char *pcVar10;
  string *psVar11;
  int iVar12;
  int i;
  uint uVar13;
  spv_instruction_t *psVar14;
  spv_opcode_desc opcodeEntry;
  AssemblyGrammar *local_2d0;
  string opcodeName;
  spv_position_t nextPosition;
  string result_id;
  string equal_sign;
  string firstWord;
  spv_operand_pattern_t expectedOperands;
  spv_position_t temp_pos;
  spv_result_t local_38;
  
  cVar3 = spvtools::AssemblyContext::peek(context);
  firstWord._M_dataplus._M_p = (pointer)&firstWord.field_2;
  if (cVar3 == '!') {
    firstWord._M_string_length = 0;
    firstWord.field_2._M_local_buf[0] = '\0';
    result_id._M_dataplus._M_p = (pointer)0x0;
    result_id._M_string_length = 0;
    result_id.field_2._M_allocated_capacity = 0;
    sVar5 = spvtools::AssemblyContext::getWord(context,&firstWord,(spv_position)&result_id);
    if (sVar5 == SPV_SUCCESS) {
      local_2d0 = grammar;
      unaff_EBP = encodeImmediate(context,firstWord._M_dataplus._M_p,pInst);
      if (unaff_EBP == SPV_SUCCESS) {
        psVar14 = pInst;
        do {
          sVar5 = spvtools::AssemblyContext::advance(context);
          unaff_EBP = SPV_SUCCESS;
          if ((sVar5 == SPV_END_OF_STREAM) ||
             (bVar4 = spvtools::AssemblyContext::isStartOfNewInst(context), bVar4)) break;
          opcodeName._M_dataplus._M_p = (pointer)&opcodeName.field_2;
          opcodeName._M_string_length = 0;
          opcodeName.field_2._M_local_buf[0] = '\0';
          sVar5 = spvtools::AssemblyContext::getWord(context,&opcodeName,(spv_position)&result_id);
          if (sVar5 == SPV_SUCCESS) {
            bVar4 = std::operator==(&opcodeName,"=");
            if (bVar4) {
              spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&temp_pos,context);
              std::operator<<((ostream *)&temp_pos,(string *)&firstWord);
              pcVar10 = " not allowed before =.";
              goto LAB_00175c4f;
            }
            temp_pos.line = 0;
            temp_pos.column = 0;
            temp_pos.index = 0;
            unaff_EBP = spvTextEncodeOperand
                                  (local_2d0,context,SPV_OPERAND_TYPE_OPTIONAL_CIV,
                                   opcodeName._M_dataplus._M_p,pInst,
                                   (spv_operand_pattern_t *)&temp_pos);
            bVar4 = unaff_EBP == SPV_SUCCESS;
            if (bVar4) {
              (context->current_position_).index = result_id.field_2._M_allocated_capacity;
              (context->current_position_).line = (size_t)result_id._M_dataplus._M_p;
              (context->current_position_).column = result_id._M_string_length;
              unaff_EBP = (spv_result_t)psVar14;
            }
            std::_Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
            ~_Vector_base((_Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> *)
                          &temp_pos);
          }
          else {
            spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&temp_pos,context,sVar5);
            pcVar10 = "Internal Error";
LAB_00175c4f:
            std::operator<<((ostream *)&temp_pos,pcVar10);
            spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&temp_pos);
            bVar4 = false;
            unaff_EBP = local_38;
          }
          psVar14 = (spv_instruction_t *)(ulong)(uint)unaff_EBP;
          std::__cxx11::string::_M_dispose();
        } while (bVar4);
      }
      goto LAB_00175e3f;
    }
    spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&temp_pos,context,sVar5);
  }
  else {
    firstWord._M_string_length = 0;
    firstWord.field_2._M_local_buf[0] = '\0';
    nextPosition.line = 0;
    nextPosition.column = 0;
    nextPosition.index = 0;
    sVar5 = spvtools::AssemblyContext::getWord(context,&firstWord,&nextPosition);
    if (sVar5 == SPV_SUCCESS) {
      opcodeName._M_dataplus._M_p = (pointer)&opcodeName.field_2;
      opcodeName._M_string_length = 0;
      opcodeName.field_2._M_local_buf[0] = '\0';
      result_id._M_dataplus._M_p = (pointer)&result_id.field_2;
      result_id._M_string_length = 0;
      result_id.field_2._M_allocated_capacity =
           result_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bVar4 = spvtools::AssemblyContext::startsWithOp(context);
      if (bVar4) {
        std::__cxx11::string::_M_assign((string *)&opcodeName);
LAB_00175d24:
        sVar5 = spvtools::AssemblyGrammar::lookupOpcode
                          (grammar,opcodeName._M_dataplus._M_p + 2,&opcodeEntry);
        if (sVar5 != SPV_SUCCESS) {
          spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&temp_pos,context,sVar5);
          std::operator<<((ostream *)&temp_pos,"Invalid Opcode name \'");
          std::operator<<((ostream *)&temp_pos,(string *)&opcodeName);
          pcVar10 = "\'";
          goto LAB_00175e14;
        }
        if (opcodeEntry->hasResult == true) {
          if (result_id._M_string_length == 0) {
            spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&temp_pos,context);
            std::operator<<((ostream *)&temp_pos,
                            "Expected <result-id> at the beginning of an instruction, found \'");
            psVar11 = &firstWord;
            goto LAB_00175e05;
          }
        }
        else if (result_id._M_string_length != 0) {
          spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&temp_pos,context);
          std::operator<<((ostream *)&temp_pos,"Cannot set ID ");
          std::operator<<((ostream *)&temp_pos,(string *)&result_id);
          std::operator<<((ostream *)&temp_pos," because ");
          std::operator<<((ostream *)&temp_pos,(string *)&opcodeName);
          pcVar10 = " does not produce a result ID.";
          goto LAB_00175e14;
        }
        pInst->opcode = opcodeEntry->opcode;
        psVar1 = &context->current_position_;
        (context->current_position_).index = nextPosition.index;
        (context->current_position_).line = nextPosition.line;
        (context->current_position_).column = nextPosition.column;
        local_2d0 = grammar;
        spvInstructionAddWord(pInst,0);
        expectedOperands.super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        expectedOperands.super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        expectedOperands.super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::reserve
                  (&expectedOperands,(ulong)opcodeEntry->numTypes);
        iVar12 = -1;
        for (uVar13 = 0; uVar13 < opcodeEntry->numTypes; uVar13 = uVar13 + 1) {
          std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
                    (&expectedOperands,
                     opcodeEntry->operandTypes + (int)((uint)opcodeEntry->numTypes + iVar12));
          iVar12 = iVar12 + -1;
        }
        sVar5 = unaff_EBP;
LAB_00175f9f:
        do {
          do {
            if (expectedOperands.
                super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>._M_impl.
                super__Vector_impl_data._M_start ==
                expectedOperands.
                super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>._M_impl.
                super__Vector_impl_data._M_finish) goto LAB_001762ec;
            type = expectedOperands.
                   super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-1];
            expectedOperands.
            super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 expectedOperands.
                 super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>._M_impl
                 .super__Vector_impl_data._M_finish + -1;
            bVar4 = spvExpandOperandSequenceOnce(type,&expectedOperands);
          } while (bVar4);
          if ((type != SPV_OPERAND_TYPE_RESULT_ID) || (result_id._M_string_length == 0)) {
            sVar6 = spvtools::AssemblyContext::advance(context);
            if (sVar6 == SPV_SUCCESS) {
              bVar4 = spvtools::AssemblyContext::isStartOfNewInst(context);
              if (!bVar4) {
                equal_sign._M_dataplus._M_p = (pointer)&equal_sign.field_2;
                equal_sign._M_string_length = 0;
                equal_sign.field_2._M_local_buf[0] = '\0';
                sVar6 = spvtools::AssemblyContext::getWord(context,&equal_sign,&nextPosition);
                if (sVar6 == SPV_SUCCESS) {
                  unaff_EBP = spvTextEncodeOperand
                                        (local_2d0,context,type,equal_sign._M_dataplus._M_p,pInst,
                                         &expectedOperands);
                  if (unaff_EBP == SPV_SUCCESS) {
                    (context->current_position_).index = nextPosition.index;
                    psVar1->line = nextPosition.line;
                    (context->current_position_).column = nextPosition.column;
                    bVar4 = true;
                    unaff_EBP = sVar5;
                  }
                  else {
                    if (unaff_EBP == SPV_FAILED_MATCH) {
                      bVar4 = spvOperandIsOptional(type);
                      unaff_EBP = (uint)!bVar4 << 2;
                      goto LAB_001760c0;
                    }
                    bVar4 = false;
                  }
                }
                else {
                  spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&temp_pos,context,sVar6)
                  ;
                  std::operator<<((ostream *)&temp_pos,"Internal Error");
                  spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&temp_pos);
                  unaff_EBP = local_38;
LAB_001760c0:
                  bVar4 = false;
                }
                std::__cxx11::string::_M_dispose();
                sVar5 = unaff_EBP;
                if (!bVar4) break;
                goto LAB_00175f9f;
              }
              bVar4 = spvOperandIsOptional(type);
              if (!bVar4) {
                spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&temp_pos,context);
                std::operator<<((ostream *)&temp_pos,"Expected operand for ");
                std::operator<<((ostream *)&temp_pos,(string *)&opcodeName);
                pcVar10 = " instruction, but found the next instruction instead.";
                goto LAB_00176418;
              }
LAB_001762ec:
              iVar7 = spvOpcodeGeneratesType(pInst->opcode);
              if (iVar7 == 0) {
                if (opcodeEntry->hasType == true) {
                  if (opcodeEntry->hasResult == false) {
                    __assert_fail("opcodeEntry->hasResult && \"Unknown opcode: has a type but no result.\""
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/text.cpp"
                                  ,0x2a8,
                                  "spv_result_t (anonymous namespace)::spvTextEncodeOpcode(const spvtools::AssemblyGrammar &, spvtools::AssemblyContext *, spv_instruction_t *)"
                                 );
                  }
                  puVar2 = (pInst->words).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  spvtools::AssemblyContext::recordTypeIdForValue(context,puVar2[2],puVar2[1]);
                }
              }
              else {
                sVar5 = spvtools::AssemblyContext::recordTypeDefinition(context,pInst);
                if (sVar5 != SPV_SUCCESS) {
                  unaff_EBP = SPV_ERROR_INVALID_TEXT;
                  break;
                }
              }
              uVar9 = (long)(pInst->words).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(pInst->words).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2;
              if (uVar9 < 0x10000) {
                uVar8 = spvOpcodeMake((uint16_t)uVar9,opcodeEntry->opcode);
                *(pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start = uVar8;
                unaff_EBP = SPV_SUCCESS;
                break;
              }
              spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&temp_pos,context);
              std::operator<<((ostream *)&temp_pos,(string *)&opcodeName);
              std::operator<<((ostream *)&temp_pos," Instruction too long: ");
              std::ostream::_M_insert<unsigned_long>((ulong)&temp_pos);
              std::operator<<((ostream *)&temp_pos," words, but the limit is ");
              std::ostream::operator<<((DiagnosticStream *)&temp_pos,0xffff);
            }
            else {
              if (sVar6 != SPV_END_OF_STREAM) {
                __assert_fail("error == SPV_SUCCESS && \"Somebody added another way to fail\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/text.cpp"
                              ,0x284,
                              "spv_result_t (anonymous namespace)::spvTextEncodeOpcode(const spvtools::AssemblyGrammar &, spvtools::AssemblyContext *, spv_instruction_t *)"
                             );
              }
              bVar4 = spvOperandIsOptional(type);
              if (bVar4) goto LAB_001762ec;
              spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&temp_pos,context);
              std::operator<<((ostream *)&temp_pos,"Expected operand for ");
              std::operator<<((ostream *)&temp_pos,(string *)&opcodeName);
              pcVar10 = " instruction, but found the end of the stream.";
LAB_00176418:
              std::operator<<((ostream *)&temp_pos,pcVar10);
            }
            spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&temp_pos);
            unaff_EBP = local_38;
            break;
          }
          temp_pos.index = (context->current_position_).index;
          temp_pos.line = psVar1->line;
          temp_pos.column = (context->current_position_).column;
          unaff_EBP = spvTextEncodeOperand
                                (local_2d0,context,SPV_OPERAND_TYPE_RESULT_ID,
                                 result_id._M_dataplus._M_p,pInst,(spv_operand_pattern_t *)0x0);
          psVar1->line = temp_pos.line;
          (context->current_position_).column = temp_pos.column;
          (context->current_position_).index = temp_pos.index;
        } while (unaff_EBP == SPV_SUCCESS);
        std::_Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::~_Vector_base
                  (&expectedOperands.
                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&result_id);
        if (*result_id._M_dataplus._M_p == '%') {
          (context->current_position_).index = nextPosition.index;
          (context->current_position_).line = nextPosition.line;
          (context->current_position_).column = nextPosition.column;
          sVar5 = spvtools::AssemblyContext::advance(context);
          if (sVar5 == SPV_SUCCESS) {
            equal_sign._M_dataplus._M_p = (pointer)&equal_sign.field_2;
            equal_sign._M_string_length = 0;
            equal_sign.field_2._M_local_buf[0] = '\0';
            spvtools::AssemblyContext::getWord(context,&equal_sign,&nextPosition);
            bVar4 = std::operator!=("=",&equal_sign);
            if (bVar4) {
              spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&temp_pos,context);
              std::operator<<((ostream *)&temp_pos,"\'=\' expected after result id but found \'");
              psVar11 = &equal_sign;
LAB_00176193:
              std::operator<<((ostream *)&temp_pos,(string *)psVar11);
              pcVar10 = "\'.";
LAB_0017621d:
              std::operator<<((ostream *)&temp_pos,pcVar10);
              spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&temp_pos);
              bVar4 = false;
              unaff_EBP = local_38;
            }
            else {
              (context->current_position_).index = nextPosition.index;
              (context->current_position_).line = nextPosition.line;
              (context->current_position_).column = nextPosition.column;
              sVar5 = spvtools::AssemblyContext::advance(context);
              if (sVar5 != SPV_SUCCESS) {
                spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&temp_pos,context);
                pcVar10 = "Expected opcode, found end of stream.";
                goto LAB_0017621d;
              }
              sVar5 = spvtools::AssemblyContext::getWord(context,&opcodeName,&nextPosition);
              if (sVar5 != SPV_SUCCESS) {
                spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&temp_pos,context,sVar5);
                pcVar10 = "Internal Error";
                goto LAB_0017621d;
              }
              bVar4 = spvtools::AssemblyContext::startsWithOp(context);
              if (!bVar4) {
                spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&temp_pos,context);
                std::operator<<((ostream *)&temp_pos,"Invalid Opcode prefix \'");
                psVar11 = &opcodeName;
                goto LAB_00176193;
              }
              bVar4 = true;
            }
            std::__cxx11::string::_M_dispose();
            if (bVar4) goto LAB_00175d24;
            goto LAB_00175e2b;
          }
          spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&temp_pos,context);
          pcVar10 = "Expected \'=\', found end of stream.";
        }
        else {
          spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&temp_pos,context);
          std::operator<<((ostream *)&temp_pos,
                          "Expected <opcode> or <result-id> at the beginning of an instruction, found \'"
                         );
          psVar11 = &result_id;
LAB_00175e05:
          std::operator<<((ostream *)&temp_pos,(string *)psVar11);
          pcVar10 = "\'.";
        }
LAB_00175e14:
        std::operator<<((ostream *)&temp_pos,pcVar10);
        spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&temp_pos);
        unaff_EBP = local_38;
      }
LAB_00175e2b:
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      goto LAB_00175e3f;
    }
    spvtools::AssemblyContext::diagnostic((DiagnosticStream *)&temp_pos,context);
  }
  std::operator<<((ostream *)&temp_pos,"Internal Error");
  spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&temp_pos);
  unaff_EBP = local_38;
LAB_00175e3f:
  std::__cxx11::string::_M_dispose();
  return unaff_EBP;
}

Assistant:

spv_result_t spvTextEncodeOpcode(const spvtools::AssemblyGrammar& grammar,
                                 spvtools::AssemblyContext* context,
                                 spv_instruction_t* pInst) {
  // Check for !<integer> first.
  if ('!' == context->peek()) {
    return encodeInstructionStartingWithImmediate(grammar, context, pInst);
  }

  std::string firstWord;
  spv_position_t nextPosition = {};
  spv_result_t error = context->getWord(&firstWord, &nextPosition);
  if (error) return context->diagnostic() << "Internal Error";

  std::string opcodeName;
  std::string result_id;
  spv_position_t result_id_position = {};
  if (context->startsWithOp()) {
    opcodeName = firstWord;
  } else {
    result_id = firstWord;
    if ('%' != result_id.front()) {
      return context->diagnostic()
             << "Expected <opcode> or <result-id> at the beginning "
                "of an instruction, found '"
             << result_id << "'.";
    }
    result_id_position = context->position();

    // The '=' sign.
    context->setPosition(nextPosition);
    if (context->advance())
      return context->diagnostic() << "Expected '=', found end of stream.";
    std::string equal_sign;
    error = context->getWord(&equal_sign, &nextPosition);
    if ("=" != equal_sign)
      return context->diagnostic() << "'=' expected after result id but found '"
                                   << equal_sign << "'.";

    // The <opcode> after the '=' sign.
    context->setPosition(nextPosition);
    if (context->advance())
      return context->diagnostic() << "Expected opcode, found end of stream.";
    error = context->getWord(&opcodeName, &nextPosition);
    if (error) return context->diagnostic(error) << "Internal Error";
    if (!context->startsWithOp()) {
      return context->diagnostic()
             << "Invalid Opcode prefix '" << opcodeName << "'.";
    }
  }

  // NOTE: The table contains Opcode names without the "Op" prefix.
  const char* pInstName = opcodeName.data() + 2;

  spv_opcode_desc opcodeEntry;
  error = grammar.lookupOpcode(pInstName, &opcodeEntry);
  if (error) {
    return context->diagnostic(error)
           << "Invalid Opcode name '" << opcodeName << "'";
  }
  if (opcodeEntry->hasResult && result_id.empty()) {
    return context->diagnostic()
           << "Expected <result-id> at the beginning of an instruction, found '"
           << firstWord << "'.";
  }
  if (!opcodeEntry->hasResult && !result_id.empty()) {
    return context->diagnostic()
           << "Cannot set ID " << result_id << " because " << opcodeName
           << " does not produce a result ID.";
  }
  pInst->opcode = opcodeEntry->opcode;
  context->setPosition(nextPosition);
  // Reserve the first word for the instruction.
  spvInstructionAddWord(pInst, 0);

  // Maintains the ordered list of expected operand types.
  // For many instructions we only need the {numTypes, operandTypes}
  // entries in opcodeEntry.  However, sometimes we need to modify
  // the list as we parse the operands. This occurs when an operand
  // has its own logical operands (such as the LocalSize operand for
  // ExecutionMode), or for extended instructions that may have their
  // own operands depending on the selected extended instruction.
  spv_operand_pattern_t expectedOperands;
  expectedOperands.reserve(opcodeEntry->numTypes);
  for (auto i = 0; i < opcodeEntry->numTypes; i++)
    expectedOperands.push_back(
        opcodeEntry->operandTypes[opcodeEntry->numTypes - i - 1]);

  while (!expectedOperands.empty()) {
    const spv_operand_type_t type = expectedOperands.back();
    expectedOperands.pop_back();

    // Expand optional tuples lazily.
    if (spvExpandOperandSequenceOnce(type, &expectedOperands)) continue;

    if (type == SPV_OPERAND_TYPE_RESULT_ID && !result_id.empty()) {
      // Handle the <result-id> for value generating instructions.
      // We've already consumed it from the text stream.  Here
      // we inject its words into the instruction.
      spv_position_t temp_pos = context->position();
      error = spvTextEncodeOperand(grammar, context, SPV_OPERAND_TYPE_RESULT_ID,
                                   result_id.c_str(), pInst, nullptr);
      result_id_position = context->position();
      // Because we are injecting we have to reset the position afterwards.
      context->setPosition(temp_pos);
      if (error) return error;
    } else {
      // Find the next word.
      error = context->advance();
      if (error == SPV_END_OF_STREAM) {
        if (spvOperandIsOptional(type)) {
          // This would have been the last potential operand for the
          // instruction,
          // and we didn't find one.  We're finished parsing this instruction.
          break;
        } else {
          return context->diagnostic()
                 << "Expected operand for " << opcodeName
                 << " instruction, but found the end of the stream.";
        }
      }
      assert(error == SPV_SUCCESS && "Somebody added another way to fail");

      if (context->isStartOfNewInst()) {
        if (spvOperandIsOptional(type)) {
          break;
        } else {
          return context->diagnostic()
                 << "Expected operand for " << opcodeName
                 << " instruction, but found the next instruction instead.";
        }
      }

      std::string operandValue;
      error = context->getWord(&operandValue, &nextPosition);
      if (error) return context->diagnostic(error) << "Internal Error";

      error = spvTextEncodeOperand(grammar, context, type, operandValue.c_str(),
                                   pInst, &expectedOperands);

      if (error == SPV_FAILED_MATCH && spvOperandIsOptional(type))
        return SPV_SUCCESS;

      if (error) return error;

      context->setPosition(nextPosition);
    }
  }

  if (spvOpcodeGeneratesType(pInst->opcode)) {
    if (context->recordTypeDefinition(pInst) != SPV_SUCCESS) {
      return SPV_ERROR_INVALID_TEXT;
    }
  } else if (opcodeEntry->hasType) {
    // SPIR-V dictates that if an instruction has both a return value and a
    // type ID then the type id is first, and the return value is second.
    assert(opcodeEntry->hasResult &&
           "Unknown opcode: has a type but no result.");
    context->recordTypeIdForValue(pInst->words[2], pInst->words[1]);
  }

  if (pInst->words.size() > SPV_LIMIT_INSTRUCTION_WORD_COUNT_MAX) {
    return context->diagnostic()
           << opcodeName << " Instruction too long: " << pInst->words.size()
           << " words, but the limit is "
           << SPV_LIMIT_INSTRUCTION_WORD_COUNT_MAX;
  }

  pInst->words[0] =
      spvOpcodeMake(uint16_t(pInst->words.size()), opcodeEntry->opcode);

  return SPV_SUCCESS;
}